

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusextratypes.h
# Opt level: O0

bool operator==(QDBusObjectPath *lhs,QDBusObjectPath *rhs)

{
  bool bVar1;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff98;
  QString *lhs_00;
  QString local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusObjectPath::path((QDBusObjectPath *)in_stack_ffffffffffffff98);
  lhs_00 = local_38;
  QDBusObjectPath::path((QDBusObjectPath *)in_stack_ffffffffffffff98);
  bVar1 = operator==(lhs_00,in_stack_ffffffffffffff98);
  QString::~QString((QString *)0x10d9c5);
  QString::~QString((QString *)0x10d9cf);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline bool operator==(const QDBusObjectPath &lhs, const QDBusObjectPath &rhs)
{ return lhs.path() == rhs.path(); }